

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O2

void __thiscall SkeletalMesh::Scene::render(Scene *this)

{
  pointer pMVar1;
  pointer pMVar2;
  int iVar3;
  sockaddr *extraout_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX_00;
  int i;
  ulong uVar4;
  long lVar5;
  
  if (this->available == true) {
    (*__glewBindVertexArray)(this->vao);
    lVar5 = 0;
    uVar4 = 0;
    __addr = extraout_RDX;
    while( true ) {
      pMVar1 = (this->meshEntry).
               super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->meshEntry).
                        super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 4) <= uVar4)
      break;
      pMVar2 = (this->material).
               super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3 = TextureImage::Texture::bind
                        (pMVar2[*(uint *)((long)&pMVar1->materialIndex + lVar5)].diffuse,0,__addr,
                         (socklen_t)pMVar2);
      if ((char)iVar3 == '\0') {
        glBindTexture(0xde1,0);
      }
      pMVar1 = (this->meshEntry).
               super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (*__glewDrawElementsBaseVertex)
                (4,*(GLsizei *)((long)&pMVar1->facetCornerNum + lVar5),0x1405,
                 (void *)((ulong)*(uint *)((long)&pMVar1->indexOffset + lVar5) << 2),
                 *(GLint *)((long)&pMVar1->vertexOffset + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
      __addr = extraout_RDX_00;
    }
    (*__glewBindVertexArray)(0);
    return;
  }
  return;
}

Assistant:

void render() const {
            if (!available) return;
            glBindVertexArray(vao);
            for (int i = 0; i < meshEntry.size(); i++) {
                if (!material[meshEntry[i].materialIndex].diffuse->bind(
                        SCENE_RESOURCE_SHADER_DIFFUSE_CHANNEL))
                    glBindTexture(GL_TEXTURE_2D, 0);

                glDrawElementsBaseVertex(GL_TRIANGLES,
                                         meshEntry[i].facetCornerNum,
                                         GL_UNSIGNED_INT,
                                         (void *) (sizeof(unsigned int) * meshEntry[i].indexOffset),
                                         meshEntry[i].vertexOffset);
            }
            glBindVertexArray(0);
        }